

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_combine_interintra
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane,uint8_t *inter_pred,int inter_stride,
               uint8_t *intra_pred,int intra_stride)

{
  int iVar1;
  int in_EDX;
  int unaff_EBP;
  BLOCK_SIZE in_SIL;
  MACROBLOCKD *in_RDI;
  undefined4 in_R8D;
  uint8_t *unaff_R15;
  uint8_t *unaff_retaddr;
  int in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  BLOCK_SIZE plane_bsize;
  int ssy;
  int ssx;
  BLOCK_SIZE in_stack_00003fca;
  BLOCK_SIZE in_stack_00003fcb;
  int8_t in_stack_00003fcc;
  int8_t in_stack_00003fcd;
  int8_t in_stack_00003fce;
  INTERINTRA_MODE in_stack_00003fcf;
  uint8_t *in_stack_00004000;
  int in_stack_00004008;
  uint8_t *in_stack_00004010;
  int in_stack_00004018;
  uint8_t *in_stack_00004020;
  int in_stack_00004028;
  int in_stack_00004030;
  BLOCK_SIZE in_stack_ffffffffffffffc2;
  BLOCK_SIZE in_stack_ffffffffffffffc3;
  
  get_plane_block_size
            (in_SIL,in_RDI->plane[in_EDX].subsampling_x,in_RDI->plane[in_EDX].subsampling_y);
  iVar1 = is_cur_buf_hbd(in_RDI);
  if (iVar1 == 0) {
    combine_interintra((INTERINTRA_MODE)((uint)in_R8D >> 0x18),(int8_t)((uint)in_R8D >> 0x10),
                       (int8_t)((uint)in_R8D >> 8),(int8_t)in_R8D,in_stack_ffffffffffffffc3,
                       in_stack_ffffffffffffffc2,unaff_R15,unaff_EBP,unaff_retaddr,in_stack_00000008
                       ,in_stack_00000010,in_stack_00000018);
  }
  else {
    combine_interintra_highbd
              (in_stack_00003fcf,in_stack_00003fce,in_stack_00003fcd,in_stack_00003fcc,
               in_stack_00003fcb,in_stack_00003fca,in_stack_00004000,in_stack_00004008,
               in_stack_00004010,in_stack_00004018,in_stack_00004020,in_stack_00004028,
               in_stack_00004030);
  }
  return;
}

Assistant:

void av1_combine_interintra(MACROBLOCKD *xd, BLOCK_SIZE bsize, int plane,
                            const uint8_t *inter_pred, int inter_stride,
                            const uint8_t *intra_pred, int intra_stride) {
  const int ssx = xd->plane[plane].subsampling_x;
  const int ssy = xd->plane[plane].subsampling_y;
  const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ssx, ssy);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    combine_interintra_highbd(
        xd->mi[0]->interintra_mode, xd->mi[0]->use_wedge_interintra,
        xd->mi[0]->interintra_wedge_index, INTERINTRA_WEDGE_SIGN, bsize,
        plane_bsize, xd->plane[plane].dst.buf, xd->plane[plane].dst.stride,
        inter_pred, inter_stride, intra_pred, intra_stride, xd->bd);
    return;
  }
#endif
  combine_interintra(
      xd->mi[0]->interintra_mode, xd->mi[0]->use_wedge_interintra,
      xd->mi[0]->interintra_wedge_index, INTERINTRA_WEDGE_SIGN, bsize,
      plane_bsize, xd->plane[plane].dst.buf, xd->plane[plane].dst.stride,
      inter_pred, inter_stride, intra_pred, intra_stride);
}